

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.hpp
# Opt level: O0

archive_result_type<pstore::serialize::archive::database_writer_&>
pstore::serialize::serializer<pstore::extent<unsigned_char>,void>::
write<pstore::serialize::archive::database_writer&>(database_writer *archive,value_type *r)

{
  value_type local_28;
  value_type *local_20;
  value_type *r_local;
  database_writer *archive_local;
  archive_result_type<pstore::serialize::archive::database_writer_&> resl;
  
  local_20 = r;
  r_local = (value_type *)archive;
  local_28 = typed_address<unsigned_char>::absolute(&r->addr);
  archive_local =
       (database_writer *)
       write<pstore::serialize::archive::database_writer&,unsigned_long>(archive,&local_28);
  write<pstore::serialize::archive::database_writer&,unsigned_long>
            ((database_writer *)r_local,&local_20->size);
  return (archive_result_type<pstore::serialize::archive::database_writer_&>)
         (value_type)archive_local;
}

Assistant:

static auto write (Archive && archive, value_type const & r)
                -> archive_result_type<Archive> {
                auto const resl = serialize::write (archive, r.addr.absolute ());
                serialize::write (archive, r.size);
                return resl;
            }